

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Net.cpp
# Opt level: O0

void __thiscall CNet::AddPin(CNet *this,vector<CPin_*,_std::allocator<CPin_*>_> *pPinList)

{
  short sVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  size_type sVar4;
  ulong uVar5;
  CPin **ppCVar6;
  reference ppCVar7;
  vector<CPin_*,_std::allocator<CPin_*>_> *pPinList_local;
  CNet *this_local;
  
  sVar4 = std::vector<CPin_*,_std::allocator<CPin_*>_>::size(pPinList);
  if (sVar4 != 0) {
    sVar4 = std::vector<CPin_*,_std::allocator<CPin_*>_>::size(pPinList);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = sVar4;
    uVar5 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppCVar6 = (CPin **)operator_new__(uVar5);
    this->m_ppPin = ppCVar6;
    this->m_iNumPin = 0;
    while (sVar1 = this->m_iNumPin,
          sVar4 = std::vector<CPin_*,_std::allocator<CPin_*>_>::size(pPinList),
          (ulong)(long)sVar1 < sVar4) {
      ppCVar7 = std::vector<CPin_*,_std::allocator<CPin_*>_>::operator[]
                          (pPinList,(long)this->m_iNumPin);
      this->m_ppPin[this->m_iNumPin] = *ppCVar7;
      this->m_iNumPin = this->m_iNumPin + 1;
    }
  }
  uVar3 = GetNumPin(this);
  if (uVar3 < 2) {
    (this->super_CObject).m_iProp = (this->super_CObject).m_iProp | 1;
  }
  else if (uVar3 == 2) {
    (this->super_CObject).m_iProp = (this->super_CObject).m_iProp & 0xfffffffe;
    (this->super_CObject).m_iProp = (this->super_CObject).m_iProp | 2;
  }
  else {
    (this->super_CObject).m_iProp = (this->super_CObject).m_iProp & 0xfffffffc;
    (this->super_CObject).m_iProp = (this->super_CObject).m_iProp | 4;
  }
  return;
}

Assistant:

void CNet::AddPin(vector<CPin*>* pPinList)
{
	if(pPinList->size())
	{
		m_ppPin	=	new	CPin*[pPinList->size()];
		for(m_iNumPin=0;m_iNumPin<pPinList->size();m_iNumPin++)	m_ppPin[m_iNumPin]	=	(*pPinList)[m_iNumPin];
	}

	switch(GetNumPin()){
	case 0:
	case 1:
		m_iProp	|=	PROP_NET_LOCAL;
		break;
	case 2:
		m_iProp	&=	~PROP_NET_LOCAL;
		m_iProp	|=	PROP_NET_TWOPIN;
		break;
	default:
		m_iProp	&=	~(PROP_NET_LOCAL|PROP_NET_TWOPIN);
		m_iProp	|=	PROP_NET_GLOBAL;
		break;
	}
}